

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fastpfor.h
# Opt level: O0

void __thiscall
FastPForLib::FastPForImpl<8U,_unsigned_long>::__decodeArray
          (FastPForImpl<8U,_unsigned_long> *this,uint32_t *in,size_t *length,unsigned_long *out,
          size_t nvalue)

{
  reference this_00;
  reference puVar1;
  long in_RCX;
  byte *pbVar2;
  long *in_RDX;
  uint *in_RSI;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RDI;
  ulong in_R8;
  uint8_t pos_1;
  uint32_t k_3;
  const_iterator *exceptionsptr;
  uint8_t pos;
  uint32_t k_2;
  uint8_t maxbits;
  uint8_t cexcept;
  uint8_t b;
  uint32_t run;
  uint32_t k_1;
  const_iterator unpackpointers [65];
  uint32_t tnvalue;
  uint32_t k;
  unsigned_long bitmap;
  uint8_t *bytep;
  uint32_t bytesize;
  uint32_t *inexcept;
  uint32_t wheremeta;
  uint32_t *headerin;
  uint32_t *initin;
  pointer *this_01;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  *this_02;
  pointer *this_03;
  unsigned_long *in_stack_fffffffffffffd38;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_2b8;
  byte local_2ad;
  uint local_2ac;
  pointer *local_2a8;
  byte local_29d;
  uint local_29c;
  byte local_297;
  byte local_296;
  byte local_295;
  uint local_294;
  unsigned_long *local_290;
  pointer local_288;
  uint local_27c;
  pointer local_278 [20];
  uint32_t in_stack_fffffffffffffe2c;
  size_t in_stack_fffffffffffffe30;
  unsigned_long *in_stack_fffffffffffffe38;
  uint32_t *in_stack_fffffffffffffe40;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Stack_70;
  uint32_t local_68;
  uint local_64;
  ulong local_60;
  uint *local_58;
  uint local_4c;
  ulong *local_48;
  uint local_3c;
  uint *local_30;
  ulong local_28;
  long local_20;
  long *local_18;
  uint *local_10;
  
  local_10 = in_RSI + 1;
  local_3c = *in_RSI;
  local_58 = in_RSI + local_3c + 1;
  local_4c = in_RSI[local_3c];
  local_48 = (ulong *)(((ulong)local_4c + 3 & 0xfffffffffffffffc) + (long)local_58);
  local_60 = *local_48;
  local_48 = local_48 + 1;
  local_30 = in_RSI;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  for (local_64 = 2; local_64 < 0x41; local_64 = local_64 + 1) {
    if ((local_60 & 1L << ((char)local_64 - 1U & 0x3f)) != 0) {
      local_68 = (uint32_t)*local_48;
      std::
      vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      ::operator[]((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                    *)&(in_RDI->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                       _M_impl.super__Vector_impl_data._M_finish,(ulong)local_64);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                (in_RDI,(size_type)in_stack_fffffffffffffd38);
      std::
      vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      ::operator[]((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                    *)&(in_RDI->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                       _M_impl.super__Vector_impl_data._M_finish,(ulong)local_64);
      in_stack_fffffffffffffd38 =
           std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x12c023);
      this_00 = std::
                vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                ::operator[]((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                              *)&(in_RDI->
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                                 _M_impl.super__Vector_impl_data._M_finish,(ulong)local_64);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(this_00);
      local_48 = (ulong *)packingvector<32U>::unpackmetight<unsigned_long>
                                    (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,
                                     in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c);
      std::
      vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      ::operator[]((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                    *)&(in_RDI->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                       _M_impl.super__Vector_impl_data._M_finish,(ulong)local_64);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                (in_RDI,(size_type)in_stack_fffffffffffffd38);
    }
  }
  *local_18 = (long)local_48 - (long)local_30 >> 2;
  this_02 = &_Stack_70;
  this_03 = local_278;
  do {
    this_01 = this_03;
    __gnu_cxx::
    __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
    ::__normal_iterator((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                         *)this_01);
    this_03 = this_01 + 1;
  } while ((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
            *)this_03 != this_02);
  for (local_27c = 1; local_27c < 0x41; local_27c = local_27c + 1) {
    std::
    vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ::operator[]((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                  *)&(in_RDI->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                     _M_impl.super__Vector_impl_data._M_finish,(ulong)local_27c);
    local_290 = (unsigned_long *)
                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_01);
    __gnu_cxx::
    __normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>
    ::__normal_iterator<unsigned_long*>
              (this_02,(__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        *)this_01);
    local_278[local_27c] = local_288;
  }
  for (local_294 = 0; (ulong)local_294 < local_28 >> 8; local_294 = local_294 + 1) {
    pbVar2 = (byte *)((long)local_58 + 1);
    local_295 = (byte)*local_58;
    local_58 = (uint *)((long)local_58 + 2);
    local_296 = *pbVar2;
    local_10 = unpackblock<256u,unsigned_long>((uint32_t *)this_02,(unsigned_long *)this_01,0);
    if (local_296 != 0) {
      local_297 = (byte)*local_58;
      if ((uint)local_297 - (uint)local_295 == 1) {
        local_58 = (uint *)((long)local_58 + 1);
        for (local_29c = 0; local_29c < local_296; local_29c = local_29c + 1) {
          local_29d = (byte)*local_58;
          *(ulong *)(local_20 + (ulong)local_29d * 8) =
               1L << (local_295 & 0x3f) | *(ulong *)(local_20 + (ulong)local_29d * 8);
          local_58 = (uint *)((long)local_58 + 1);
        }
      }
      else {
        local_2a8 = local_278 + (int)((uint)local_297 - (uint)local_295);
        local_58 = (uint *)((long)local_58 + 1);
        for (local_2ac = 0; local_2ac < local_296; local_2ac = local_2ac + 1) {
          local_2ad = (byte)*local_58;
          local_58 = (uint *)((long)local_58 + 1);
          local_2b8 = __gnu_cxx::
                      __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                      ::operator++((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                    *)this_03,(int)((ulong)this_02 >> 0x20));
          puVar1 = __gnu_cxx::
                   __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                   ::operator*(&local_2b8);
          *(unsigned_long *)(local_20 + (ulong)local_2ad * 8) =
               *puVar1 << (local_295 & 0x3f) | *(ulong *)(local_20 + (ulong)local_2ad * 8);
        }
      }
    }
    local_20 = local_20 + 0x800;
  }
  return;
}

Assistant:

void __decodeArray(const uint32_t *in, size_t &length, IntType *out,
                     const size_t nvalue) {
    const uint32_t *const initin = in;
    const uint32_t *const headerin = in++;
    const uint32_t wheremeta = headerin[0];
    const uint32_t *inexcept = headerin + wheremeta;
    const uint32_t bytesize = *inexcept++;
    const uint8_t *bytep = reinterpret_cast<const uint8_t *>(inexcept);
    inexcept += (bytesize + sizeof(uint32_t) - 1) / sizeof(uint32_t);
    IntType bitmap = *(reinterpret_cast<const IntType *>(inexcept));
    inexcept += (sizeof(IntType) + sizeof(uint32_t) - 1) / sizeof(uint32_t);
    for (uint32_t k = 2; k <= sizeof(IntType) * 8; ++k) {
      if ((bitmap & (1ULL << (k - 1))) != 0) {
        uint32_t tnvalue = *inexcept;
        datatobepacked[k].resize((tnvalue + PACKSIZE - 1) / PACKSIZE * PACKSIZE);
        inexcept = packingvector<32>::unpackmetight(
            inexcept, datatobepacked[k].data(), datatobepacked[k].size(), k);
        datatobepacked[k].resize(tnvalue);
      }
    }
    length = inexcept - initin;
    typename std::vector<IntType>::const_iterator
        unpackpointers[sizeof(IntType) * 8 + 1];
    for (uint32_t k = 1; k <= sizeof(IntType) * 8; ++k) {
      unpackpointers[k] = datatobepacked[k].begin();
    }
    for (uint32_t run = 0; run < nvalue / BlockSize; ++run, out += BlockSize) {
      const uint8_t b = *bytep++;
      const uint8_t cexcept = *bytep++;
      in = unpackblock<BlockSize>(in, out, b);
      if (cexcept > 0) {
        const uint8_t maxbits = *bytep++;
        if (maxbits - b == 1) {
          for (uint32_t k = 0; k < cexcept; ++k) {
            const uint8_t pos = *(bytep++);
            out[pos] |= static_cast<uint64_t>(1) << b;
          }
        } else {
          typename std::vector<IntType>::const_iterator &exceptionsptr =
              unpackpointers[maxbits - b];
          for (uint32_t k = 0; k < cexcept; ++k) {
            const uint8_t pos = *(bytep++);
            out[pos] |= (static_cast<uint64_t>(*(exceptionsptr++))) << b;
          }
        }
      }
    }
    assert(in == headerin + wheremeta);
  }